

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  uchar uVar1;
  byte bVar2;
  long lVar3;
  _Bool _Var4;
  char cVar5;
  uint uVar6;
  CURLcode CVar7;
  CURLUcode CVar8;
  uint uVar9;
  char *sep;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  char *pcVar13;
  Curl_handler *pCVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  int iVar19;
  char cVar20;
  uint uVar21;
  uint uVar22;
  uchar *mem;
  CURLU *pCVar23;
  byte bVar24;
  char *pcVar25;
  bool bVar26;
  long local_70;
  char *oldurl;
  char *endp;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      free_urlhandle(u);
      u->query = (char *)0x0;
      u->fragment = (char *)0x0;
      u->port = (char *)0x0;
      u->path = (char *)0x0;
      u->host = (char *)0x0;
      u->zoneid = (char *)0x0;
      u->password = (char *)0x0;
      u->options = (char *)0x0;
      u->scheme = (char *)0x0;
      u->user = (char *)0x0;
      u->portnum = 0;
      goto LAB_0043caba;
    case CURLUPART_SCHEME:
      break;
    case CURLUPART_USER:
      u = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      u = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      u = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      u = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      u = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      u = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u = (CURLU *)&u->fragment;
      break;
    case CURLUPART_ZONEID:
      u = (CURLU *)&u->zoneid;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if (u->scheme == (char *)0x0) {
      return CURLUE_OK;
    }
    (*Curl_cfree)(u->scheme);
    u->scheme = (char *)0x0;
    return CURLUE_OK;
  }
  if (CURLUPART_ZONEID < what) {
    return CURLUE_UNKNOWN_PART;
  }
  bVar24 = (byte)flags >> 7;
  switch(what) {
  case CURLUPART_URL:
    sVar10 = Curl_is_absolute_url(part,(char *)0x0,(size_t)part,(flags & 0x204) != 0);
    if ((sVar10 != 0) ||
       (CVar8 = curl_url_get(u,CURLUPART_URL,&oldurl,flags), pcVar13 = oldurl, CVar8 != CURLUE_OK))
    {
      CVar8 = parseurl_and_replace(part,u,flags);
      return CVar8;
    }
    pcVar15 = strstr(oldurl,"//");
    pcVar25 = pcVar15 + 2;
    if (pcVar15 == (char *)0x0) {
      pcVar25 = pcVar13;
    }
    cVar5 = *part;
    if (cVar5 == '/') {
      if (part[1] == '/') {
        *pcVar25 = '\0';
        part = part + 2;
        _Var4 = false;
      }
      else {
        pcVar15 = strchr(pcVar25,0x2f);
        pcVar16 = strchr(pcVar25,0x3f);
        if (pcVar15 != (char *)0x0) {
          pcVar17 = pcVar15;
          if (pcVar16 < pcVar15) {
            pcVar17 = pcVar16;
          }
          if (pcVar16 == (char *)0x0) {
            pcVar17 = pcVar15;
          }
          *pcVar17 = '\0';
          goto LAB_0043d0f1;
        }
        _Var4 = true;
        if (pcVar16 != (char *)0x0) {
          *pcVar16 = '\0';
        }
      }
    }
    else {
      pcVar15 = strchr(pcVar25,0x3f);
      if (pcVar15 != (char *)0x0) {
        *pcVar15 = '\0';
        cVar5 = *part;
      }
      cVar20 = '?';
      if ((cVar5 != '?') &&
         (pcVar15 = strrchr(pcVar25,0x2f), cVar20 = cVar5, pcVar15 != (char *)0x0)) {
        *pcVar15 = '\0';
        cVar20 = *part;
      }
      pcVar15 = strchr(pcVar25,0x2f);
      pcVar25 = pcVar15 + 1;
      if (pcVar15 == (char *)0x0) {
        pcVar25 = (char *)0x0;
      }
      if (cVar20 == '.') {
        part = part + (ulong)(part[1] == '/') * 2;
      }
      iVar19 = 0;
      for (; ((*part == '.' && (part[1] == '.')) && (part[2] == '/')); part = part + 3) {
        iVar19 = iVar19 + -1;
      }
      if (pcVar15 == (char *)0x0) {
        pcVar25 = (char *)0x0;
      }
      else {
        for (; iVar19 != 0; iVar19 = iVar19 + 1) {
          pcVar16 = strrchr(pcVar25,0x2f);
          if (pcVar16 == (char *)0x0) {
            *pcVar25 = '\0';
            pcVar25 = pcVar15 + 1;
            break;
          }
          *pcVar16 = '\0';
        }
      }
LAB_0043d0f1:
      _Var4 = true;
    }
    Curl_dyn_init((dynbuf *)&endp,8000000);
    CVar7 = Curl_dyn_add((dynbuf *)&endp,pcVar13);
    if (CVar7 == CURLE_OK) {
      cVar5 = *part;
      if (cVar5 != '/') {
        if (pcVar25 == (char *)0x0) {
          if (cVar5 != '?') goto LAB_0043d1ae;
        }
        else if ((cVar5 != '?') && (*pcVar25 != '\0')) {
LAB_0043d1ae:
          CVar7 = Curl_dyn_addn((dynbuf *)&endp,"/",1);
          if (CVar7 != CURLE_OK) goto LAB_0043d114;
        }
      }
      sVar12 = strlen(part);
      urlencode_str((dynbuf *)&endp,part,sVar12,_Var4,false);
      pcVar13 = Curl_dyn_ptr((dynbuf *)&endp);
    }
    else {
LAB_0043d114:
      pcVar13 = (char *)0x0;
    }
    (*Curl_cfree)(oldurl);
    if (pcVar13 == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    CVar8 = parseurl_and_replace(pcVar13,u,flags);
    (*Curl_cfree)(pcVar13);
    return CVar8;
  case CURLUPART_SCHEME:
    sVar12 = strlen(part);
    if (0x28 < sVar12) {
      return CURLUE_BAD_SCHEME;
    }
    bVar26 = true;
    if (((flags & 8) == 0) &&
       (pCVar14 = Curl_builtin_scheme(part,0xffffffffffffffff), pCVar14 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    uVar9 = 0;
    bVar2 = 0;
    bVar24 = 0;
    local_70 = 0;
    pCVar23 = u;
    goto LAB_0043cbe6;
  case CURLUPART_USER:
    pCVar23 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    pCVar23 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    pCVar23 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    sVar12 = strcspn(part," \r\n");
    sVar11 = strlen(part);
    if (sVar11 == sVar12) {
      pCVar23 = (CURLU *)&u->host;
      (*Curl_cfree)(u->zoneid);
      u->zoneid = (char *)0x0;
      break;
    }
    goto LAB_0043ce92;
  case CURLUPART_PORT:
    local_70 = strtol(part,&endp,10);
    if (local_70 - 0x10000U < 0xffffffffffff0001) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*endp != '\0') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    uVar9 = 0;
    bVar26 = true;
    bVar2 = 0;
    bVar24 = 0;
    pCVar23 = (CURLU *)&u->port;
    goto LAB_0043cbe6;
  case CURLUPART_PATH:
    pCVar23 = (CURLU *)&u->path;
    bVar2 = 1;
    uVar9 = 0;
    bVar26 = true;
    goto LAB_0043cbdd;
  case CURLUPART_QUERY:
    bVar26 = -1 < (char)(byte)flags;
    uVar9 = flags >> 8;
    pCVar23 = (CURLU *)&u->query;
    goto LAB_0043cbd4;
  case CURLUPART_FRAGMENT:
    pCVar23 = (CURLU *)&u->fragment;
    break;
  case CURLUPART_ZONEID:
    pCVar23 = (CURLU *)&u->zoneid;
  }
  bVar26 = true;
  uVar9 = 0;
LAB_0043cbd4:
  bVar2 = 0;
LAB_0043cbdd:
  local_70 = 0;
LAB_0043cbe6:
  sVar12 = strlen(part);
  if (sVar12 < 0x7a1201) {
    CVar8 = CURLUE_OUT_OF_MEMORY;
    if (bVar24 == 0) {
      pcVar13 = (*Curl_cstrdup)(part);
      if (pcVar13 != (char *)0x0) {
        lVar3 = 1;
        pcVar25 = pcVar13;
        do {
          lVar18 = lVar3;
          if (*pcVar25 == '%') {
            bVar24 = pcVar25[1];
            if (((((byte)(bVar24 - 0x30) < 10) ||
                 ((bVar24 - 0x41 < 0x26 &&
                  ((0x3f0000003fU >> ((ulong)(bVar24 - 0x41) & 0x3f) & 1) != 0)))) &&
                ((bVar2 = pcVar25[2], (byte)(bVar2 - 0x30) < 10 ||
                 ((bVar2 - 0x41 < 0x26 &&
                  ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)))))) &&
               ((byte)(bVar24 + 0xbf) < 0x1a || (byte)(bVar2 + 0xbf) < 0x1a)) {
              cVar5 = Curl_raw_tolower(bVar24);
              pcVar25[1] = cVar5;
              cVar5 = Curl_raw_tolower(pcVar25[2]);
              pcVar25[2] = cVar5;
              lVar18 = 3;
            }
          }
          else if (*pcVar25 == '\0') goto LAB_0043cdb2;
          pcVar25 = pcVar25 + lVar18;
        } while( true );
      }
    }
    else {
      Curl_dyn_init((dynbuf *)&endp,sVar12 * 3 + 1);
      uVar21 = uVar9;
      for (; uVar1 = *part, uVar1 != '\0'; part = (char *)((uchar *)part + 1)) {
        if (uVar1 == ' ' && !bVar26) {
          mem = "+";
LAB_0043cc99:
          CVar7 = Curl_dyn_addn((dynbuf *)&endp,mem,1);
        }
        else {
          _Var4 = Curl_isunreserved(uVar1);
          uVar1 = *part;
          if (((bool)(uVar1 == '/' & bVar2) || _Var4) || ((uVar1 == '=' && ((uVar21 & 1) != 0)))) {
            uVar6 = uVar21 & 0xff;
            uVar22 = uVar6;
            if ((uVar21 & 1) != 0) {
              uVar22 = 0;
            }
            mem = (uchar *)part;
            uVar21 = uVar22;
            if (uVar1 != '=') {
              uVar21 = uVar6;
            }
            goto LAB_0043cc99;
          }
          CVar7 = Curl_dyn_addf((dynbuf *)&endp,"%%%02x");
        }
        if (CVar7 != CURLE_OK) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
      pcVar13 = Curl_dyn_ptr((dynbuf *)&endp);
LAB_0043cdb2:
      if ((((uVar9 & 1) == 0) || (pcVar25 = u->query, pcVar25 == (char *)0x0)) ||
         (sVar12 = strlen(pcVar25), sVar12 == 0)) {
        if (((what == CURLUPART_HOST) &&
            (sVar12 = strlen(pcVar13), ((byte)(flags >> 10) & sVar12 == 0) == 0)) &&
           (CVar8 = hostname_check(u,pcVar13,sVar12), CVar8 != CURLUE_OK)) {
          (*Curl_cfree)(pcVar13);
LAB_0043ce92:
          CVar8 = CURLUE_BAD_HOSTNAME;
        }
        else {
          (*Curl_cfree)(pCVar23->scheme);
          pCVar23->scheme = pcVar13;
          CVar8 = CURLUE_OK;
          if (local_70 != 0) {
            u->portnum = local_70;
          }
        }
      }
      else {
        cVar5 = pcVar25[sVar12 - 1];
        Curl_dyn_init((dynbuf *)&endp,8000000);
        CVar7 = Curl_dyn_addn((dynbuf *)&endp,u->query,sVar12);
        if (((CVar7 == CURLE_OK) &&
            ((cVar5 == '&' || (CVar7 = Curl_dyn_addn((dynbuf *)&endp,"&",1), CVar7 == CURLE_OK))))
           && (CVar7 = Curl_dyn_add((dynbuf *)&endp,pcVar13), CVar7 == CURLE_OK)) {
          (*Curl_cfree)(pcVar13);
          (*Curl_cfree)(pCVar23->scheme);
          pcVar13 = Curl_dyn_ptr((dynbuf *)&endp);
          pCVar23->scheme = pcVar13;
LAB_0043caba:
          CVar8 = CURLUE_OK;
        }
        else {
          (*Curl_cfree)(pcVar13);
        }
      }
    }
  }
  else {
    CVar8 = CURLUE_MALFORMED_INPUT;
  }
  return CVar8;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  long port = 0;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    else if(!storep) {
      free_urlhandle(u);
      memset(u, 0, sizeof(struct Curl_URL));
    }
    return CURLUE_OK;
  }

  switch(what) {
  case CURLUPART_SCHEME:
    if(strlen(part) > MAX_SCHEME_LEN)
      /* too long */
      return CURLUE_BAD_SCHEME;
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) &&
       /* verify that it is a fine scheme */
       !Curl_builtin_scheme(part, CURL_ZERO_TERMINATED))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    break;
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST: {
    size_t len = strcspn(part, " \r\n");
    if(strlen(part) != len)
      /* hostname with bad content */
      return CURLUE_BAD_HOSTNAME;
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  }
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
  {
    char *endp;
    urlencode = FALSE; /* never */
    port = strtol(part, &endp, 10);  /* Port number must be decimal */
    if((port <= 0) || (port > 0xffff))
      return CURLUE_BAD_PORT_NUMBER;
    if(*endp)
      /* weirdly provided number, not good! */
      return CURLUE_BAD_PORT_NUMBER;
    storep = &u->port;
  }
  break;
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    equalsencode = appendquery;
    storep = &u->query;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode result;
    char *oldurl;
    char *redired_url;

    /* if the new thing is absolute or the old one is not
     * (we could not get an absolute url in 'oldurl'),
     * then replace the existing with the new. */
    if(Curl_is_absolute_url(part, NULL, 0,
                            flags & (CURLU_GUESS_SCHEME|
                                     CURLU_DEFAULT_SCHEME))
       || curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
      return parseurl_and_replace(part, u, flags);
    }

    /* apply the relative part to create a new URL
     * and replace the existing one with it. */
    redired_url = concat_url(oldurl, part);
    free(oldurl);
    if(!redired_url)
      return CURLUE_OUT_OF_MEMORY;

    result = parseurl_and_replace(redired_url, u, flags);
    free(redired_url);
    return result;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp = part;
    size_t nalloc = strlen(part);

    if(nalloc > CURL_MAX_INPUT_LENGTH)
      /* excessive input length */
      return CURLUE_MALFORMED_INPUT;

    if(urlencode) {
      const unsigned char *i;
      struct dynbuf enc;

      Curl_dyn_init(&enc, nalloc * 3 + 1);

      for(i = (const unsigned char *)part; *i; i++) {
        CURLcode result;
        if((*i == ' ') && plusencode) {
          result = Curl_dyn_addn(&enc, "+", 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else if(Curl_isunreserved(*i) ||
                ((*i == '/') && urlskipslash) ||
                ((*i == '=') && equalsencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          result = Curl_dyn_addn(&enc, i, 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else {
          result = Curl_dyn_addf(&enc, "%%%02x", *i);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
      }
      newp = Curl_dyn_ptr(&enc);
    }
    else {
      char *p;
      newp = strdup(part);
      if(!newp)
        return CURLUE_OUT_OF_MEMORY;
      p = (char *)newp;
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = Curl_raw_tolower(p[1]);
          p[2] = Curl_raw_tolower(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }

    if(appendquery) {
      /* Append the 'newp' string onto the old query. Add a '&' separator if
         none is present at the end of the existing query already */

      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        struct dynbuf enc;
        Curl_dyn_init(&enc, CURL_MAX_INPUT_LENGTH);

        if(Curl_dyn_addn(&enc, u->query, querylen)) /* add original query */
          goto nomem;

        if(addamperand) {
          if(Curl_dyn_addn(&enc, "&", 1))
            goto nomem;
        }
        if(Curl_dyn_add(&enc, newp))
          goto nomem;
        free((char *)newp);
        free(*storep);
        *storep = Curl_dyn_ptr(&enc);
        return CURLUE_OK;
        nomem:
        free((char *)newp);
        return CURLUE_OUT_OF_MEMORY;
      }
    }

    if(what == CURLUPART_HOST) {
      size_t n = strlen(newp);
      if(!n && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it's allowed to be empty. */
      }
      else {
        if(hostname_check(u, (char *)newp, n)) {
          free((char *)newp);
          return CURLUE_BAD_HOSTNAME;
        }
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  /* set after the string, to make it not assigned if the allocation above
     fails */
  if(port)
    u->portnum = port;
  return CURLUE_OK;
}